

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int runtest(int i)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *__file;
  int *piVar6;
  undefined8 extraout_RDX;
  char *out;
  char *filename;
  ulong uVar7;
  stat buf;
  stat64 sStack_1e8;
  stat64 *psStack_158;
  testDesc *ptStack_150;
  ulong uStack_148;
  code *pcStack_140;
  long local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  long local_118;
  char *local_110;
  glob64_t local_108;
  stat64 local_c0;
  
  local_11c = nb_errors;
  local_124 = nb_tests;
  local_120 = nb_leaks;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    pcStack_140 = (code *)0x106368;
    printf("## %s\n");
  }
  pcStack_140 = (code *)0x106381;
  lVar4 = xmlGetCharEncodingHandler(6);
  pcStack_140 = (code *)0x10638e;
  local_118 = xmlGetCharEncodingHandler(0x15);
  if (testDescriptions[i].in == (char *)0x0) {
    testErrorsSize = 0;
    testErrors[0] = '\0';
    extraMemoryFromResolver = 0;
    pcStack_140 = (code *)0x1066bc;
    iVar1 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar1 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_108.gl_offs = 0;
    pcStack_140 = (code *)0x1063bd;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_108);
    if (local_108.gl_pathc != 0) {
      local_128 = 0;
      uVar7 = 0;
      local_130 = lVar4;
      do {
        pcStack_140 = (code *)0x1063f5;
        iVar1 = stat64(local_108.gl_pathv[uVar7],&local_c0);
        if ((iVar1 != -1) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
          if (lVar4 == 0) {
            pcStack_140 = (code *)0x10645c;
            pcVar5 = strstr(local_108.gl_pathv[uVar7],"ebcdic");
            if (pcVar5 != (char *)0x0) goto LAB_00106645;
          }
          if (local_118 == 0) {
            pcStack_140 = (code *)0x10647c;
            pcVar5 = strstr(local_108.gl_pathv[uVar7],"icu_parse_test");
            if (pcVar5 != (char *)0x0) goto LAB_00106645;
          }
          if (testDescriptions[i].suffix == (char *)0x0) {
            pcVar5 = (char *)0x0;
          }
          else {
            filename = local_108.gl_pathv[uVar7];
            out = testDescriptions[i].out;
            pcStack_140 = (code *)0x10643a;
            pcVar5 = resultFilename(filename,out,testDescriptions[i].suffix);
            if (pcVar5 == (char *)0x0) {
              pcStack_140 = (code *)0x10674a;
              runtest_cold_1();
              goto LAB_0010674a;
            }
          }
          if (testDescriptions[i].err == (char *)0x0) {
            __file = (char *)0x0;
          }
          else {
            filename = local_108.gl_pathv[uVar7];
            out = testDescriptions[i].out;
            pcStack_140 = (code *)0x1064a4;
            __file = resultFilename(filename,out,testDescriptions[i].err);
            if (__file == (char *)0x0) {
LAB_0010674a:
              pcStack_140 = testExternalEntityLoader;
              runtest_cold_2();
              psStack_158 = &local_c0;
              ptStack_150 = testDescriptions + i;
              uStack_148 = uVar7;
              pcStack_140 = (code *)pcVar5;
              iVar1 = stat64(filename,&sStack_1e8);
              if ((iVar1 != -1) && ((sStack_1e8.st_mode & 0xf000) == 0x8000)) {
                iVar1 = xmlNoNetExternalEntityLoader(filename,out,extraout_RDX);
                return iVar1;
              }
              iVar1 = xmlMemUsed();
              iVar2 = xmlNoNetExternalEntityLoader(filename,out,extraout_RDX);
              iVar3 = xmlMemUsed();
              extraMemoryFromResolver = extraMemoryFromResolver + (iVar3 - iVar1);
              return iVar2;
            }
          }
          if (pcVar5 == (char *)0x0) {
LAB_001064f1:
            if (__file == (char *)0x0) {
LAB_0010652e:
              pcStack_140 = (code *)0x106533;
              iVar1 = xmlMemUsed();
              extraMemoryFromResolver = 0;
              testErrorsSize = 0;
              testErrors[0] = '\0';
              pcStack_140 = (code *)0x10656c;
              iVar2 = (*testDescriptions[i].func)
                                (local_108.gl_pathv[uVar7],pcVar5,__file,
                                 testDescriptions[i].options | 0x10000);
              pcStack_140 = (code *)0x106574;
              xmlResetLastError();
              if (iVar2 == 0) {
                pcStack_140 = (code *)0x10657e;
                iVar2 = xmlMemUsed();
                if (iVar2 != iVar1) {
                  pcStack_140 = (code *)0x10658f;
                  iVar2 = xmlMemUsed();
                  __stream = _stderr;
                  if ((iVar2 != iVar1) && (extraMemoryFromResolver == 0)) {
                    local_110 = local_108.gl_pathv[uVar7];
                    pcStack_140 = (code *)0x1065ba;
                    iVar2 = xmlMemUsed();
                    pcStack_140 = (code *)0x1065d8;
                    fprintf(__stream,"File %s leaked %d bytes\n",local_110,
                            (ulong)(uint)(iVar2 - iVar1));
                    piVar6 = &nb_leaks;
                    goto LAB_0010660c;
                  }
                }
              }
              else {
                pcStack_140 = (code *)0x106602;
                fprintf(_stderr,"File %s generated an error\n",local_108.gl_pathv[uVar7]);
                piVar6 = &nb_errors;
LAB_0010660c:
                *piVar6 = *piVar6 + 1;
                local_128 = local_128 + 1;
              }
              testErrorsSize = 0;
              lVar4 = local_130;
            }
            else {
              pcStack_140 = (code *)0x106501;
              iVar1 = stat64(__file,&local_c0);
              if ((iVar1 != -1 && (local_c0.st_mode & 0xf000) == 0x8000) ||
                 ((update_results & 1) != 0)) goto LAB_0010652e;
              pcStack_140 = (code *)0x10668d;
              fprintf(_stderr,"Missing error file %s\n",__file);
            }
            if (pcVar5 != (char *)0x0) goto LAB_0010662b;
          }
          else {
            pcStack_140 = (code *)0x1064c4;
            iVar1 = stat64(pcVar5,&local_c0);
            if ((iVar1 != -1 && (local_c0.st_mode & 0xf000) == 0x8000) ||
               ((update_results & 1) != 0)) goto LAB_001064f1;
            pcStack_140 = (code *)0x106670;
            fprintf(_stderr,"Missing result file %s\n",pcVar5);
LAB_0010662b:
            pcStack_140 = (code *)0x106633;
            free(pcVar5);
          }
          if (__file != (char *)0x0) {
            pcStack_140 = (code *)0x106640;
            free(__file);
          }
        }
LAB_00106645:
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_108.gl_pathc);
    }
    pcStack_140 = (code *)0x106699;
    globfree64(&local_108);
  }
  pcStack_140 = (code *)0x1066ce;
  xmlCharEncCloseFunc(lVar4);
  pcStack_140 = (code *)0x1066d8;
  iVar1 = xmlCharEncCloseFunc(local_118);
  if (verbose == '\x01') {
    if (nb_leaks == local_120 && nb_errors == local_11c) {
      pcStack_140 = (code *)0x10671d;
      iVar1 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - local_124));
    }
    else {
      pcStack_140 = (code *)0x106733;
      iVar1 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - local_124),
                     (ulong)(uint)(nb_errors - local_11c),(ulong)(uint)(nb_leaks - local_120));
    }
  }
  return iVar1;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}